

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O2

ssize_t __thiscall stk::FileWrite::write(FileWrite *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  StkFormat SVar2;
  size_t sVar3;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  FILE *__s;
  unsigned_long k;
  long lVar4;
  undefined4 in_register_00000034;
  long *plVar5;
  SINT16 *__ptr;
  unsigned_long k_6;
  unsigned_long k_1;
  Type TStack_50;
  SINT16 sample;
  undefined6 uStack_3e;
  long local_38;
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if (this->fd_ == (FILE *)0x0) {
    std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                    "FileWrite::write(): a file has not yet been opened!");
    TStack_50 = WARNING;
  }
  else {
    if (*(uint *)(plVar5 + 3) == this->channels_) {
      local_38 = plVar5[4];
      SVar2 = this->dataType_;
      if (SVar2 == 2) {
        lVar4 = 0;
        do {
          if (local_38 == lVar4) goto LAB_0010eee3;
          _sample = CONCAT62(uStack_3e,(short)(int)(*(double *)(*plVar5 + lVar4 * 8) * 32767.0));
          if (this->byteswap_ == true) {
            Stk::swap16((uchar *)&sample);
          }
          sVar3 = fwrite(&sample,2,1,(FILE *)this->fd_);
          lVar4 = lVar4 + 1;
        } while (sVar3 == 1);
      }
      else if (SVar2 == 1) {
        if (this->fileType_ == 2) {
          lVar4 = 0;
          do {
            if (local_38 == lVar4) goto LAB_0010eee3;
            _sample = CONCAT71(stack0xffffffffffffffc1,
                               (char)(int)(*(double *)(*plVar5 + lVar4 * 8) * 127.0 + 128.0));
            sVar3 = fwrite(&sample,1,1,(FILE *)this->fd_);
            lVar4 = lVar4 + 1;
          } while (sVar3 == 1);
        }
        else {
          lVar4 = 0;
          do {
            if (local_38 == lVar4) goto LAB_0010eee3;
            _sample = CONCAT71(stack0xffffffffffffffc1,
                               (char)(int)(*(double *)(*plVar5 + lVar4 * 8) * 127.0));
            sVar3 = fwrite(&sample,1,1,(FILE *)this->fd_);
            lVar4 = lVar4 + 1;
          } while (sVar3 == 1);
        }
      }
      else if (SVar2 == 8) {
        lVar4 = 0;
        do {
          if (local_38 == lVar4) goto LAB_0010eee3;
          _sample = CONCAT44(uStack_3e._2_4_,(int)(*(double *)(*plVar5 + lVar4 * 8) * 2147483647.0))
          ;
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&sample);
          }
          sVar3 = fwrite(&sample,4,1,(FILE *)this->fd_);
          lVar4 = lVar4 + 1;
        } while (sVar3 == 1);
      }
      else if (SVar2 == 0x10) {
        lVar4 = 0;
        do {
          if (local_38 == lVar4) goto LAB_0010eee3;
          _sample = CONCAT44(uStack_3e._2_4_,(float)*(double *)(*plVar5 + lVar4 * 8));
          if (this->byteswap_ == true) {
            Stk::swap32((uchar *)&sample);
          }
          sVar3 = fwrite(&sample,4,1,(FILE *)this->fd_);
          lVar4 = lVar4 + 1;
        } while (sVar3 == 1);
      }
      else {
        if (SVar2 != 0x20) {
          if (SVar2 == 4) {
            for (lVar4 = 0; local_38 != lVar4; lVar4 = lVar4 + 1) {
              _sample = CONCAT44(uStack_3e._2_4_,(int)(*(double *)(*plVar5 + lVar4 * 8) * 8388607.0)
                                );
              if (this->byteswap_ == true) {
                Stk::swap32((uchar *)&sample);
                __s = (FILE *)this->fd_;
                __ptr = (SINT16 *)((long)&sample + 1);
              }
              else {
                __s = (FILE *)this->fd_;
                __ptr = &sample;
              }
              sVar3 = fwrite(__ptr,3,1,__s);
              if (sVar3 != 1) goto LAB_0010ec12;
            }
          }
LAB_0010eee3:
          uVar1 = *(uint *)(plVar5 + 2);
          this->frameCounter_ = this->frameCounter_ + (ulong)uVar1;
          return (ulong)uVar1;
        }
        lVar4 = 0;
        do {
          if (local_38 == lVar4) goto LAB_0010eee3;
          _sample = *(undefined8 *)(*plVar5 + lVar4 * 8);
          if (this->byteswap_ == true) {
            Stk::swap64((uchar *)&sample);
          }
          sVar3 = fwrite(&sample,8,1,(FILE *)this->fd_);
          lVar4 = lVar4 + 1;
        } while (sVar3 == 1);
      }
LAB_0010ec12:
      std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                      "FileWrite::write(): error writing data to file!");
      Stk::handleError(&this->super_Stk,FILE_ERROR);
      return extraout_RAX;
    }
    std::operator<<((ostream *)Stk::oStream__abi_cxx11_,
                    "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!"
                   );
    TStack_50 = FUNCTION_ARGUMENT;
  }
  Stk::handleError(&this->super_Stk,TStack_50);
  return extraout_RAX_00;
}

Assistant:

void FileWrite :: write( StkFrames& buffer )
{
  if ( fd_ == 0 ) {
    oStream_ << "FileWrite::write(): a file has not yet been opened!";
    handleError( StkError::WARNING );
    return;
  }

  if ( buffer.channels() != channels_ ) {
    oStream_ << "FileWrite::write(): number of channels in the StkFrames argument does not match that specified to open() function!";
    handleError( StkError::FUNCTION_ARGUMENT );
    return;
  }

  unsigned long nSamples = buffer.size();
  if ( dataType_ == STK_SINT16 ) {
    SINT16 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT16) (buffer[k] * 32767.0);
      //sample = ((SINT16) (( buffer[k] + 1.0 ) * 32767.5 + 0.5)) - 32768;
      if ( byteswap_ ) swap16( (unsigned char *)&sample );
      if ( fwrite(&sample, 2, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT8 ) {
    if ( fileType_ == FILE_WAV ) { // 8-bit WAV data is unsigned!
      unsigned char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (unsigned char) (buffer[k] * 127.0 + 128.0);
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
    else {
      signed char sample;
      for ( unsigned long k=0; k<nSamples; k++ ) {
        sample = (signed char) (buffer[k] * 127.0);
        //sample = ((signed char) (( buffer[k] + 1.0 ) * 127.5 + 0.5)) - 128;
        if ( fwrite(&sample, 1, 1, fd_) != 1 ) goto error;
      }
    }
  }
  else if ( dataType_ == STK_SINT32 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 2147483647.0);
      //sample = ((SINT32) (( buffer[k] + 1.0 ) * 2147483647.5 + 0.5)) - 2147483648;
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT32 ) {
    FLOAT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT32) (buffer[k]);
      if ( byteswap_ ) swap32( (unsigned char *)&sample );
      if ( fwrite(&sample, 4, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_FLOAT64 ) {
    FLOAT64 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (FLOAT64) (buffer[k]);
      if ( byteswap_ ) swap64( (unsigned char *)&sample );
      if ( fwrite(&sample, 8, 1, fd_) != 1 ) goto error;
    }
  }
  else if ( dataType_ == STK_SINT24 ) {
    SINT32 sample;
    for ( unsigned long k=0; k<nSamples; k++ ) {
      sample = (SINT32) (buffer[k] * 8388607.0);
      if ( byteswap_ ) {
        swap32( (unsigned char *)&sample );
        unsigned char *ptr = (unsigned char *) &sample;
        if ( fwrite(ptr+1, 3, 1, fd_) != 1 ) goto error;
      }
      else
        if ( fwrite(&sample, 3, 1, fd_) != 1 ) goto error;
    }
  }

  frameCounter_ += buffer.frames();
  return;

 error:
  oStream_ << "FileWrite::write(): error writing data to file!";
  handleError( StkError::FILE_ERROR );
}